

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.capnp.h
# Opt level: O0

void __thiscall capnp::compiler::Expression::Builder::setBinary(Builder *this,Reader value)

{
  PointerBuilder builder;
  Reader value_00;
  uint uVar1;
  PointerBuilder local_38;
  Builder *local_20;
  Builder *this_local;
  Reader value_local;
  
  value_local.super_ArrayPtr<const_unsigned_char>.ptr =
       (uchar *)value.super_ArrayPtr<const_unsigned_char>.size_;
  this_local = (Builder *)value.super_ArrayPtr<const_unsigned_char>.ptr;
  local_20 = this;
  uVar1 = bounded<0u>();
  capnp::_::StructBuilder::setDataField<capnp::compiler::Expression::Which>
            (&this->_builder,uVar1,BINARY);
  uVar1 = bounded<0u>();
  capnp::_::StructBuilder::getPointerField(&local_38,&this->_builder,uVar1);
  value_00.super_ArrayPtr<const_unsigned_char>.size_ =
       (size_t)value_local.super_ArrayPtr<const_unsigned_char>.ptr;
  value_00.super_ArrayPtr<const_unsigned_char>.ptr = (uchar *)this_local;
  builder.capTable = local_38.capTable;
  builder.segment = local_38.segment;
  builder.pointer = local_38.pointer;
  capnp::_::PointerHelpers<capnp::Data,_(capnp::Kind)1>::set(builder,value_00);
  return;
}

Assistant:

inline void Expression::Builder::setBinary( ::capnp::Data::Reader value) {
  _builder.setDataField<Expression::Which>(
      ::capnp::bounded<0>() * ::capnp::ELEMENTS, Expression::BINARY);
  ::capnp::_::PointerHelpers< ::capnp::Data>::set(_builder.getPointerField(
      ::capnp::bounded<0>() * ::capnp::POINTERS), value);
}